

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
             int isCreate)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  Rtree *pRtree;
  sqlite3_str *psVar7;
  char *pcVar8;
  Mem *pMem;
  i64 iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  i64 iVar14;
  int *piVar15;
  u64 n;
  bool bVar16;
  bool bVar17;
  sqlite3_stmt *p;
  char *local_98;
  sqlite3_stmt *local_80;
  sqlite3_stmt **local_78 [9];
  
  if (0x67 < argc) {
    pcVar4 = sqlite3_mprintf("%s","Too many columns for an rtree table");
    *pzErr = pcVar4;
    return 1;
  }
  sqlite3_vtab_config(db,1,1);
  sVar5 = strlen(argv[1]);
  sVar6 = strlen(argv[2]);
  iVar3 = sqlite3_initialize();
  if (iVar3 != 0) {
    return 7;
  }
  n = (long)(int)sVar6 + (long)(int)sVar5 + 0x3ca;
  pRtree = (Rtree *)sqlite3Malloc(n);
  if (pRtree == (Rtree *)0x0) {
    return 7;
  }
  bVar16 = false;
  memset(pRtree,0,n);
  pRtree->nBusy = 1;
  (pRtree->base).pModule = &rtreeModule;
  pRtree->zDb = (char *)(pRtree + 1);
  pcVar4 = (char *)((long)&pRtree[1].base.pModule + ((long)((sVar5 << 0x20) + 0x100000000) >> 0x20))
  ;
  pRtree->zName = pcVar4;
  pRtree->eCoordType = pAux != (void *)0x0;
  memcpy(pRtree + 1,argv[1],(long)(int)sVar5);
  memcpy(pcVar4,argv[2],(long)(int)sVar6);
  psVar7 = sqlite3_str_new(db);
  sqlite3_str_appendf(psVar7,"CREATE TABLE x(%s",argv[3]);
  if (4 < argc) {
    bVar16 = true;
    uVar13 = 5;
    do {
      pcVar4 = argv[uVar13 - 1];
      if (*pcVar4 == '+') {
        pRtree->nAux = pRtree->nAux + '\x01';
        pcVar4 = pcVar4 + 1;
      }
      else {
        if (pRtree->nAux != '\0') break;
        pRtree->nDim2 = pRtree->nDim2 + '\x01';
      }
      sqlite3_str_appendf(psVar7,",%s",pcVar4);
      bVar16 = uVar13 < (uint)argc;
      bVar17 = uVar13 != (uint)argc;
      uVar13 = uVar13 + 1;
    } while (bVar17);
  }
  sqlite3_str_appendf(psVar7,");");
  pcVar4 = sqlite3_str_finish(psVar7);
  if (pcVar4 == (char *)0x0) {
    iVar3 = 7;
  }
  else {
    if (bVar16) {
      pcVar8 = sqlite3_mprintf("%s","Auxiliary rtree columns must be last");
      iVar3 = 1;
    }
    else {
      iVar3 = sqlite3_declare_vtab(db,pcVar4);
      if (iVar3 == 0) {
        sqlite3_free(pcVar4);
        bVar1 = pRtree->nDim2;
        pRtree->nDim = bVar1 >> 1;
        lVar11 = 2;
        if (((bVar1 < 2) || (lVar11 = 3, 10 < bVar1)) || (lVar11 = 1, (bVar1 & 1) != 0)) {
          pcVar4 = *(char **)(&DAT_0020db20 + lVar11 * 8);
          iVar3 = 0;
        }
        else {
          pRtree->nBytesPerCell = bVar1 * '\x04' + '\b';
          if (isCreate == 0) {
            pcVar4 = sqlite3_mprintf("SELECT length(data) FROM \'%q\'.\'%q_node\' WHERE nodeno = 1",
                                     pRtree->zDb,pRtree->zName);
            iVar3 = getIntFromStmt(db,pcVar4,&pRtree->iNodeSize);
            if (iVar3 != 0) goto LAB_001cacb1;
            if (pRtree->iNodeSize < 0x1c0) {
              pcVar8 = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",pRtree->zName);
              iVar3 = 0x10b;
              goto LAB_001cacc7;
            }
            sqlite3_free(pcVar4);
            local_98 = argv[1];
            pcVar4 = argv[2];
            pRtree->db = db;
LAB_001caf73:
            local_78[0] = &pRtree->pWriteNode;
            local_78[1] = &pRtree->pDeleteNode;
            local_78[2] = &pRtree->pReadRowid;
            local_78[3] = &pRtree->pWriteRowid;
            local_78[4] = &pRtree->pDeleteRowid;
            local_78[5] = &pRtree->pReadParent;
            local_78[6] = &pRtree->pWriteParent;
            local_78[7] = &pRtree->pDeleteParent;
            iVar3 = sqlite3_table_column_metadata
                              (db,pRtree->zDb,"sqlite_stat1",(char *)0x0,(char **)0x0,(char **)0x0,
                               (int *)0x0,(int *)0x0,(int *)0x0);
            if (iVar3 == 0) {
              pcVar8 = sqlite3_mprintf("SELECT stat FROM %Q.sqlite_stat1 WHERE tbl = \'%q_rowid\'",
                                       pRtree->zDb,pRtree->zName);
              if (pcVar8 == (char *)0x0) {
LAB_001cb188:
                iVar3 = 7;
              }
              else {
                iVar3 = sqlite3LockAndPrepare(db,pcVar8,-1,0x80,(Vdbe *)0x0,&local_80,(char **)0x0);
                if (iVar3 == 7) goto LAB_001cb0e2;
                iVar14 = 0x100000;
                if (iVar3 != 0) {
LAB_001cb0ef:
                  pRtree->nRowEst = iVar14;
                  sqlite3_free(pcVar8);
                  goto LAB_001cb100;
                }
                iVar3 = sqlite3_step(local_80);
                if (iVar3 == 100) {
                  pMem = columnMem(local_80,0);
                  iVar9 = sqlite3VdbeIntValue(pMem);
                  columnMallocFailure(local_80);
                  iVar3 = sqlite3_finalize(local_80);
                  if (iVar3 == 0) {
                    if ((iVar9 != 0) && (iVar14 = 100, 100 < iVar9)) {
                      iVar14 = iVar9;
                    }
                    goto LAB_001cb0ef;
                  }
                }
                else {
                  iVar3 = sqlite3_finalize(local_80);
                  if (iVar3 == 0) goto LAB_001cb0ef;
                }
LAB_001cb0e2:
                sqlite3_free(pcVar8);
              }
            }
            else {
              pRtree->nRowEst = 0x100000;
              if (iVar3 == 1) {
LAB_001cb100:
                piVar15 = &rtreeSqlInit_azSql_rel;
                uVar13 = 0;
                do {
                  if ((uVar13 != 3) ||
                     (pcVar8 = 
                      "INSERT INTO\"%w\".\"%w_rowid\"(rowid,nodeno)VALUES(?1,?2)ON CONFLICT(rowid)DO UPDATE SET nodeno=excluded.nodeno"
                     , pRtree->nAux == '\0')) {
                    pcVar8 = (char *)((long)&rtreeSqlInit_azSql_rel + (long)*piVar15);
                  }
                  pcVar8 = sqlite3_mprintf(pcVar8,local_98,pcVar4);
                  if (pcVar8 == (char *)0x0) goto LAB_001cb188;
                  iVar3 = sqlite3LockAndPrepare
                                    (db,pcVar8,-1,0x85,(Vdbe *)0x0,local_78[uVar13],(char **)0x0);
                  sqlite3_free(pcVar8);
                  if (6 < uVar13) break;
                  uVar13 = uVar13 + 1;
                  piVar15 = piVar15 + 1;
                } while (iVar3 == 0);
              }
            }
            if (pRtree->nAux == '\0') {
LAB_001cb2e8:
              if (iVar3 == 0) {
                *ppVtab = (sqlite3_vtab *)pRtree;
                return 0;
              }
            }
            else {
              pcVar8 = sqlite3_mprintf("SELECT * FROM \"%w\".\"%w_rowid\" WHERE rowid=?1",local_98,
                                       pcVar4);
              pRtree->zReadAuxSql = pcVar8;
              iVar3 = 7;
              if (pcVar8 != (char *)0x0) {
                psVar7 = sqlite3_str_new(db);
                sqlite3_str_appendf(psVar7,"UPDATE \"%w\".\"%w_rowid\"SET ",local_98,pcVar4);
                if (pRtree->nAux != '\0') {
                  uVar12 = 0;
                  do {
                    if (uVar12 != 0) {
                      uVar2 = psVar7->nChar;
                      uVar10 = uVar2 + 1;
                      if (uVar10 < psVar7->nAlloc) {
                        psVar7->nChar = uVar10;
                        psVar7->zText[uVar2] = ',';
                      }
                      else {
                        enlargeAndAppend(psVar7,",",1);
                      }
                    }
                    if (uVar12 < pRtree->nAuxNotNull) {
                      sqlite3_str_appendf(psVar7,"a%d=coalesce(?%d,a%d)",(ulong)uVar12,
                                          (ulong)(uVar12 + 2));
                    }
                    else {
                      sqlite3_str_appendf(psVar7,"a%d=?%d",(ulong)uVar12,(ulong)(uVar12 + 2));
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 < pRtree->nAux);
                }
                sqlite3_str_appendf(psVar7," WHERE rowid=?1");
                pcVar4 = sqlite3_str_finish(psVar7);
                if (pcVar4 != (char *)0x0) {
                  iVar3 = sqlite3LockAndPrepare
                                    (db,pcVar4,-1,0x85,(Vdbe *)0x0,&pRtree->pWriteAux,(char **)0x0);
                  sqlite3_free(pcVar4);
                  goto LAB_001cb2e8;
                }
              }
            }
          }
          else {
            local_78[0] = (sqlite3_stmt **)((ulong)local_78[0] & 0xffffffff00000000);
            pcVar4 = sqlite3_mprintf("PRAGMA %Q.page_size",pRtree->zDb);
            iVar3 = getIntFromStmt(db,pcVar4,(int *)local_78);
            if (iVar3 != 0) {
              pcVar8 = sqlite3_errmsg(db);
              pcVar8 = sqlite3_mprintf("%s",pcVar8);
              *pzErr = pcVar8;
              goto LAB_001caccd;
            }
            iVar3 = (uint)pRtree->nBytesPerCell * 0x33 + 4;
            if ((int)local_78[0] + -0x40 <= iVar3) {
              iVar3 = (int)local_78[0] + -0x40;
            }
            pRtree->iNodeSize = iVar3;
            sqlite3_free(pcVar4);
            local_98 = argv[1];
            pcVar4 = argv[2];
            pRtree->db = db;
            psVar7 = sqlite3_str_new(db);
            sqlite3_str_appendf(psVar7,
                                "CREATE TABLE \"%w\".\"%w_rowid\"(rowid INTEGER PRIMARY KEY,nodeno",
                                local_98,pcVar4);
            if (pRtree->nAux != '\0') {
              uVar13 = 0;
              do {
                sqlite3_str_appendf(psVar7,",a%d",uVar13);
                uVar12 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar12;
              } while (uVar12 < pRtree->nAux);
            }
            sqlite3_str_appendf(psVar7,
                                ");CREATE TABLE \"%w\".\"%w_node\"(nodeno INTEGER PRIMARY KEY,data);"
                                ,local_98,pcVar4);
            sqlite3_str_appendf(psVar7,
                                "CREATE TABLE \"%w\".\"%w_parent\"(nodeno INTEGER PRIMARY KEY,parentnode);"
                                ,local_98,pcVar4);
            sqlite3_str_appendf(psVar7,"INSERT INTO \"%w\".\"%w_node\"VALUES(1,zeroblob(%d))",
                                local_98);
            pcVar8 = sqlite3_str_finish(psVar7);
            if (pcVar8 == (char *)0x0) {
              iVar3 = 7;
            }
            else {
              iVar3 = sqlite3_exec(db,pcVar8,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
              sqlite3_free(pcVar8);
              if (iVar3 == 0) goto LAB_001caf73;
            }
          }
          pcVar4 = sqlite3_errmsg(db);
        }
        pcVar4 = sqlite3_mprintf("%s",pcVar4);
        *pzErr = pcVar4;
        goto LAB_001cacd2;
      }
LAB_001cacb1:
      pcVar8 = sqlite3_errmsg(db);
      pcVar8 = sqlite3_mprintf("%s",pcVar8);
    }
LAB_001cacc7:
    *pzErr = pcVar8;
  }
LAB_001caccd:
  sqlite3_free(pcVar4);
LAB_001cacd2:
  rtreeRelease(pRtree);
  return iVar3 + (uint)(iVar3 == 0);
}

Assistant:

static int rtreeInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  int nDb;              /* Length of string argv[1] */
  int nName;            /* Length of string argv[2] */
  int eCoordType = (pAux ? RTREE_COORD_INT32 : RTREE_COORD_REAL32);
  sqlite3_str *pSql;
  char *zSql;
  int ii = 4;
  int iErr;

  const char *aErrMsg[] = {
    0,                                                    /* 0 */
    "Wrong number of columns for an rtree table",         /* 1 */
    "Too few columns for an rtree table",                 /* 2 */
    "Too many columns for an rtree table",                /* 3 */
    "Auxiliary rtree columns must be last"                /* 4 */
  };

  assert( RTREE_MAX_AUX_COLUMN<256 ); /* Aux columns counted by a u8 */
  if( argc>RTREE_MAX_AUX_COLUMN+3 ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[3]);
    return SQLITE_ERROR;
  }

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);

  /* Allocate the sqlite3_vtab structure */
  nDb = (int)strlen(argv[1]);
  nName = (int)strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName+2);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName+2);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->eCoordType = (u8)eCoordType;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(%s", argv[3]);
  for(ii=4; ii<argc; ii++){
    if( argv[ii][0]=='+' ){
      pRtree->nAux++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]+1);
    }else if( pRtree->nAux>0 ){
      break;
    }else{
      pRtree->nDim2++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]);
    }
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( ii<argc ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[4]);
    rc = SQLITE_ERROR;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto rtreeInit_fail;
  pRtree->nDim = pRtree->nDim2/2;
  if( pRtree->nDim<1 ){
    iErr = 2;
  }else if( pRtree->nDim2>RTREE_MAX_DIMENSIONS*2 ){
    iErr = 3;
  }else if( pRtree->nDim2 % 2 ){
    iErr = 1;
  }else{
    iErr = 0;
  }
  if( iErr ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[iErr]);
    goto rtreeInit_fail;
  }
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto rtreeInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto rtreeInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

rtreeInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}